

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minheap_test.cpp
# Opt level: O2

int main(void)

{
  event *ev;
  int i_1;
  int i;
  long lVar1;
  event *peStack_2048;
  event *inserted [1024];
  MinHeap<event> MinHeap;
  
  inserted[0x3ff] = (event *)0x0;
  for (lVar1 = 0; lVar1 != 0x400; lVar1 = lVar1 + 1) {
    ev = (event *)malloc(0x18);
    inserted[lVar1 + -1] = ev;
    set_random_timeout(ev);
    sznet::MinHeap<event>::push((MinHeap<event> *)(inserted + 0x3ff),ev);
  }
  sznet::MinHeap<event>::checkHeap((MinHeap<event> *)(inserted + 0x3ff));
  __assert_fail("MinHeap.size() == 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/minheap_test.cpp"
                ,0x4b,"int main()");
}

Assistant:

int main()
{
	event* inserted[1024];
	MinHeap<event> MinHeap(&event_greater);

	for (int i = 0; i < 1024; ++i)
	{
		inserted[i] = (event*)malloc(sizeof(event));
		set_random_timeout(inserted[i]);
		MinHeap.push(inserted[i]);
	}

	MinHeap.checkHeap();
	assert(MinHeap.size() == 1024);
	// MinHeap.LevelPrint(event_getstr);

	int sum = 512;
	int rst = 0;
	while (sum > 0)
	{
		uint32_t index = rand() % 1024;
		if (index < MinHeap.size() && inserted[index]->min_heap_idx != -1)
		{
			rst = MinHeap.erase(inserted[index]);
			assert(rst == 0);
			--sum;
		}
	}
	MinHeap.checkHeap();
	assert(MinHeap.size() == 512);

	sum = 500;
	event* e = nullptr;
	while (sum > 0)
	{
		e = MinHeap.pop();
		assert(e != nullptr);
		--sum;
	}

	MinHeap.checkHeap();
	assert(MinHeap.size() == 12);
	MinHeap.levelPrint(event_getstr);

	for (int i = 0; i < 1024; ++i)
	{
		free(inserted[i]);
	}

	return 0;
}